

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O2

bool __thiscall ON_LineCurve::Reverse(ON_LineCurve *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ON_3dPoint p;
  
  dVar1 = (this->m_line).from.z;
  dVar2 = (this->m_line).from.x;
  dVar3 = (this->m_line).from.y;
  dVar4 = (this->m_line).to.y;
  (this->m_line).from.x = (this->m_line).to.x;
  (this->m_line).from.y = dVar4;
  (this->m_line).from.z = (this->m_line).to.z;
  (this->m_line).to.x = dVar2;
  (this->m_line).to.y = dVar3;
  (this->m_line).to.z = dVar1;
  ON_Interval::Reverse(&this->m_t);
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return true;
}

Assistant:

bool
ON_LineCurve::Reverse()
{
  const ON_3dPoint p = m_line.from;
  m_line.from = m_line.to;
  m_line.to = p;
  m_t.Reverse();
	DestroyCurveTree();
  return true;
}